

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O3

DdNode * Cudd_addHamming(DdManager *dd,DdNode **xVars,DdNode **yVars,int nVars)

{
  int *piVar1;
  DdNode *B;
  DdNode *f;
  DdNode *pDVar2;
  ulong uVar3;
  DdNode *g;
  ulong uVar4;
  
  pDVar2 = dd->zero;
  uVar3 = (ulong)pDVar2 & 0xfffffffffffffffe;
  *(int *)(uVar3 + 4) = *(int *)(uVar3 + 4) + 1;
  if (0 < nVars) {
    uVar4 = 0;
    g = pDVar2;
    do {
      B = Cudd_bddIte(dd,xVars[uVar4],(DdNode *)((ulong)yVars[uVar4] ^ 1),yVars[uVar4]);
      if (B == (DdNode *)0x0) goto LAB_00790f7b;
      piVar1 = (int *)(((ulong)B & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      f = Cudd_BddToAdd(dd,B);
      if (f == (DdNode *)0x0) {
LAB_00790f76:
        Cudd_RecursiveDeref(dd,B);
LAB_00790f7b:
        Cudd_RecursiveDeref(dd,g);
        return (DdNode *)0x0;
      }
      piVar1 = (int *)(((ulong)f & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDeref(dd,B);
      pDVar2 = Cudd_addApply(dd,Cudd_addPlus,f,g);
      B = f;
      if (pDVar2 == (DdNode *)0x0) goto LAB_00790f76;
      uVar3 = (ulong)pDVar2 & 0xfffffffffffffffe;
      *(int *)(uVar3 + 4) = *(int *)(uVar3 + 4) + 1;
      Cudd_RecursiveDeref(dd,f);
      Cudd_RecursiveDeref(dd,g);
      uVar4 = uVar4 + 1;
      g = pDVar2;
    } while ((uint)nVars != uVar4);
  }
  *(int *)(uVar3 + 4) = *(int *)(uVar3 + 4) + -1;
  return pDVar2;
}

Assistant:

DdNode *
Cudd_addHamming(
  DdManager * dd,
  DdNode ** xVars,
  DdNode ** yVars,
  int  nVars)
{
    DdNode  *result,*tempBdd;
    DdNode  *tempAdd,*temp;
    int     i;

    result = DD_ZERO(dd);
    cuddRef(result);

    for (i = 0; i < nVars; i++) {
        tempBdd = Cudd_bddIte(dd,xVars[i],Cudd_Not(yVars[i]),yVars[i]);
        if (tempBdd == NULL) {
            Cudd_RecursiveDeref(dd,result);
            return(NULL);
        }
        cuddRef(tempBdd);
        tempAdd = Cudd_BddToAdd(dd,tempBdd);
        if (tempAdd == NULL) {
            Cudd_RecursiveDeref(dd,tempBdd);
            Cudd_RecursiveDeref(dd,result);
            return(NULL);
        }
        cuddRef(tempAdd);
        Cudd_RecursiveDeref(dd,tempBdd);
        temp = Cudd_addApply(dd,Cudd_addPlus,tempAdd,result);
        if (temp == NULL) {
            Cudd_RecursiveDeref(dd,tempAdd);
            Cudd_RecursiveDeref(dd,result);
            return(NULL);
        }
        cuddRef(temp);
        Cudd_RecursiveDeref(dd,tempAdd);
        Cudd_RecursiveDeref(dd,result);
        result = temp;
    }

    cuddDeref(result);
    return(result);

}